

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall icu_63::ZNStringPool::ZNStringPool(ZNStringPool *this,UErrorCode *status)

{
  UBool UVar1;
  ZNStringPoolChunk *this_00;
  UHashtable *pUVar2;
  UErrorCode *size;
  ZNStringPoolChunk *local_48;
  UErrorCode *status_local;
  ZNStringPool *this_local;
  
  this->fChunks = (ZNStringPoolChunk *)0x0;
  this->fHash = (UHashtable *)0x0;
  size = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this_00 = (ZNStringPoolChunk *)UMemory::operator_new((UMemory *)0xfb0,(size_t)size);
    local_48 = (ZNStringPoolChunk *)0x0;
    if (this_00 != (ZNStringPoolChunk *)0x0) {
      ZNStringPoolChunk::ZNStringPoolChunk(this_00);
      local_48 = this_00;
    }
    this->fChunks = local_48;
    if (this->fChunks == (ZNStringPoolChunk *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      pUVar2 = uhash_open_63(uhash_hashUChars_63,uhash_compareUChars_63,uhash_compareUChars_63,
                             status);
      this->fHash = pUVar2;
      ::U_FAILURE(*status);
    }
  }
  return;
}

Assistant:

ZNStringPool::ZNStringPool(UErrorCode &status) {
    fChunks = NULL;
    fHash   = NULL;
    if (U_FAILURE(status)) {
        return;
    }
    fChunks = new ZNStringPoolChunk;
    if (fChunks == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    fHash   = uhash_open(uhash_hashUChars      /* keyHash */, 
                         uhash_compareUChars   /* keyComp */, 
                         uhash_compareUChars   /* valueComp */, 
                         &status);
    if (U_FAILURE(status)) {
        return;
    }
}